

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

SectionTracker *
Catch::TestCaseTracking::SectionTracker::acquire
          (TrackerContext *ctx,NameAndLocation *nameAndLocation)

{
  ITracker *pIVar1;
  int iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  ITracker *local_60;
  SectionTracker *local_58;
  ITrackerPtr childTracker;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  undefined1 local_29;
  
  pIVar1 = ctx->m_currentTracker;
  (*pIVar1->_vptr_ITracker[0xc])(&local_58,pIVar1,nameAndLocation);
  if (local_58 == (SectionTracker *)0x0) {
    childTracker.super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_60 = pIVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Catch::TestCaseTracking::SectionTracker,std::allocator<Catch::TestCaseTracking::SectionTracker>,Catch::TestCaseTracking::NameAndLocation_const&,Catch::TestCaseTracking::TrackerContext&,Catch::TestCaseTracking::ITracker*>
              (a_Stack_40,
               (SectionTracker **)
               &childTracker.
                super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(allocator<Catch::TestCaseTracking::SectionTracker> *)&local_29,
               nameAndLocation,ctx,&local_60);
    this._M_pi = a_Stack_40[0]._M_pi;
    _Var3 = childTracker.
            super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    if ((element_type *)a_Stack_40[0]._M_pi != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((NameAndLocation *)&(a_Stack_40[0]._M_pi)->_M_use_count)->name)._M_dataplus._M_p
             = *(int *)&(((NameAndLocation *)&(a_Stack_40[0]._M_pi)->_M_use_count)->name).
                        _M_dataplus._M_p + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((NameAndLocation *)&(a_Stack_40[0]._M_pi)->_M_use_count)->name)._M_dataplus._M_p
             = *(int *)&(((NameAndLocation *)&(a_Stack_40[0]._M_pi)->_M_use_count)->name).
                        _M_dataplus._M_p + 1;
      }
    }
    (*pIVar1->_vptr_ITracker[0xb])
              (pIVar1,&childTracker.
                       super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
    if ((element_type *)a_Stack_40[0]._M_pi != (element_type *)0x0) {
      clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)a_Stack_40[0]._M_pi);
    }
  }
  else {
    this._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 childTracker.
                 super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
    _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58;
    if (childTracker.
        super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((childTracker.
                   super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->m_nameAndLocation).name._M_dataplus._M_p =
             *(int *)&((childTracker.
                        super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->m_nameAndLocation).name._M_dataplus._M_p + 1;
        UNLOCK();
      }
      else {
        *(int *)&((childTracker.
                   super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->m_nameAndLocation).name._M_dataplus._M_p =
             *(int *)&((childTracker.
                        super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->m_nameAndLocation).name._M_dataplus._M_p + 1;
      }
    }
  }
  if (childTracker.super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               childTracker.
               super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  }
  if ((ctx->m_runState != CompletedCycle) &&
     (iVar2 = (*(((SectionTracker *)_Var3._M_pi)->super_TrackerBase).super_ITracker._vptr_ITracker
                [2])(_Var3._M_pi), (char)iVar2 == '\0')) {
    (((SectionTracker *)_Var3._M_pi)->super_TrackerBase).m_runState = Executing;
    ((((SectionTracker *)_Var3._M_pi)->super_TrackerBase).m_ctx)->m_currentTracker =
         (ITracker *)_Var3._M_pi;
    pIVar1 = (((SectionTracker *)_Var3._M_pi)->super_TrackerBase).m_parent;
    if (pIVar1 != (ITracker *)0x0) {
      (*pIVar1->_vptr_ITracker[0xd])();
    }
  }
  if ((element_type *)this._M_pi != (element_type *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_pi);
  }
  return (SectionTracker *)_Var3._M_pi;
}

Assistant:

SectionTracker& SectionTracker::acquire(TrackerContext& ctx, NameAndLocation const& nameAndLocation) {
            std::shared_ptr<SectionTracker> section;

            ITracker& currentTracker = ctx.currentTracker();
            if (ITrackerPtr childTracker = currentTracker.findChild(nameAndLocation)) {
                assert(childTracker);
                assert(childTracker->isSectionTracker());
                section = std::static_pointer_cast<SectionTracker>(childTracker);
            } else {
                section = std::make_shared<SectionTracker>(nameAndLocation, ctx, &currentTracker);
                currentTracker.addChild(section);
            }
            if (!ctx.completedCycle())
                section->tryOpen();
            return *section;
        }